

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.h
# Opt level: O2

bool __thiscall cmdline::parser::parse(parser *this,int argc,char **argv)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  size_type sVar6;
  mapped_type *pmVar7;
  _Base_ptr p_Var8;
  char *pcVar9;
  size_type sVar10;
  mapped_type *ppoVar11;
  int iVar12;
  ulong uVar13;
  parser *this_00;
  long lVar14;
  _Self __tmp;
  char *pcVar15;
  char initial;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_f0;
  parser *local_e8;
  int local_e0;
  allocator<char> local_d9;
  ulong local_d8;
  string name;
  char last;
  string val;
  map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  lookup;
  
  local_f0 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->errors;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_f0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->others);
  local_e0 = argc;
  if (argc < 1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&lookup,"argument number must be longer than 0",(allocator<char> *)&name);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              (local_f0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&lookup
              );
    std::__cxx11::string::~string((string *)&lookup);
    bVar2 = false;
  }
  else {
    bVar2 = std::operator==(&this->prog_name,"");
    if (bVar2) {
      std::__cxx11::string::assign((char *)&this->prog_name);
    }
    lookup._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &lookup._M_t._M_impl.super__Rb_tree_header._M_header;
    lookup._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    lookup._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    lookup._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    p_Var1 = &(this->options)._M_t._M_impl.super__Rb_tree_header;
    local_e8 = this;
    lookup._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         lookup._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    for (p_Var8 = (this->options)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var8 != p_Var1; p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8)) {
      if ((p_Var8[1]._M_parent != (_Base_ptr)0x0) &&
         (initial = (**(code **)(**(long **)(p_Var8 + 2) + 0x48))(), initial != '\0')) {
        sVar6 = std::
                map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::count(&lookup,&initial);
        if (sVar6 != 0) {
          pmVar7 = std::
                   map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](&lookup,&initial);
          std::__cxx11::string::assign((char *)pmVar7);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&last,"short option \'",&local_d9);
          std::operator+(&val,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &last,initial);
          std::operator+(&name,&val,"\' is ambiguous");
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>(local_f0,&name);
          std::__cxx11::string::~string((string *)&name);
          std::__cxx11::string::~string((string *)&val);
          std::__cxx11::string::~string((string *)&last);
          bVar2 = false;
          goto LAB_00112d9e;
        }
        pmVar7 = std::
                 map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&lookup,&initial);
        std::__cxx11::string::_M_assign((string *)pmVar7);
      }
    }
    uVar13 = 1;
    this_00 = local_e8;
    while (iVar12 = (int)uVar13, iVar12 < local_e0) {
      pcVar15 = argv[iVar12];
      local_d8 = uVar13;
      if (*pcVar15 != '-') {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&name,pcVar15,(allocator<char> *)&val);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &this->others,&name);
        iVar12 = (int)local_d8;
        goto LAB_001128dd;
      }
      if (pcVar15[1] == '-') {
        pcVar15 = pcVar15 + 2;
        pcVar9 = strchr(pcVar15,0x3d);
        if (pcVar9 == (char *)0x0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&name,pcVar15,(allocator<char> *)&val);
          sVar10 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
                   ::count(&this_00->options,&name);
          iVar12 = (int)local_d8;
          if (sVar10 == 0) {
            std::operator+(&val,"undefined option: --",&name);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>(local_f0,&val);
            goto LAB_001128b0;
          }
          ppoVar11 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
                     ::operator[](&this_00->options,&name);
          iVar4 = (*(*ppoVar11)->_vptr_option_base[2])();
          if ((char)iVar4 == '\0') {
            set_option(this_00,&name);
          }
          else {
            iVar12 = iVar12 + 1;
            if (local_e0 <= iVar12) {
              std::operator+(&val,"option needs value: --",&name);
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>(local_f0,&val);
              iVar12 = (int)local_d8;
              goto LAB_001128b0;
            }
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&val,argv[iVar12],(allocator<char> *)&last);
            set_option(this_00,&name,&val);
            std::__cxx11::string::~string((string *)&val);
          }
        }
        else {
          name._M_dataplus._M_p = (pointer)&name.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&name,pcVar15,pcVar9);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&val,pcVar9 + 1,(allocator<char> *)&last);
          set_option(this_00,&name,&val);
          iVar12 = (int)local_d8;
LAB_001128b0:
          std::__cxx11::string::~string((string *)&val);
        }
LAB_001128dd:
        std::__cxx11::string::~string((string *)&name);
      }
      else if (pcVar15[1] != '\0') {
        lVar14 = 1;
        last = pcVar15[1];
        while (pcVar15[lVar14 + 1] != '\0') {
          last = pcVar15[lVar14 + 1];
          sVar6 = std::
                  map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::count(&lookup,pcVar15 + lVar14);
          if (sVar6 == 0) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&val,"undefined short option: -",(allocator<char> *)&initial);
            std::operator+(&name,&val,argv[iVar12][lVar14]);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>(local_f0,&name);
LAB_001129b9:
            std::__cxx11::string::~string((string *)&name);
            std::__cxx11::string::~string((string *)&val);
          }
          else {
            pmVar7 = std::
                     map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[](&lookup,argv[iVar12] + lVar14);
            bVar2 = std::operator==(pmVar7,"");
            if (bVar2) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&val,"ambiguous short option: -",(allocator<char> *)&initial);
              std::operator+(&name,&val,argv[iVar12][lVar14]);
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>(local_f0,&name);
              goto LAB_001129b9;
            }
            pmVar7 = std::
                     map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[](&lookup,argv[iVar12] + lVar14);
            set_option(local_e8,pmVar7);
          }
          lVar14 = lVar14 + 1;
          pcVar15 = argv[iVar12];
        }
        sVar6 = std::
                map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::count(&lookup,&last);
        iVar12 = (int)local_d8;
        if (sVar6 == 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&val,"undefined short option: -",(allocator<char> *)&initial);
          std::operator+(&name,&val,last);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>(local_f0,&name);
        }
        else {
          pmVar7 = std::
                   map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](&lookup,&last);
          bVar2 = std::operator==(pmVar7,"");
          if (!bVar2) {
            iVar4 = iVar12 + 1;
            if (iVar4 < local_e0) {
              pmVar7 = std::
                       map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator[](&lookup,&last);
              ppoVar11 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
                         ::operator[](&local_e8->options,pmVar7);
              iVar5 = (*(*ppoVar11)->_vptr_option_base[2])();
              if ((char)iVar5 != '\0') {
                pmVar7 = std::
                         map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::operator[](&lookup,&last);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&name,argv[iVar4],(allocator<char> *)&val);
                set_option(local_e8,pmVar7,&name);
                std::__cxx11::string::~string((string *)&name);
                this_00 = local_e8;
                iVar12 = iVar4;
                goto LAB_001128e5;
              }
            }
            pmVar7 = std::
                     map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[](&lookup,&last);
            set_option(local_e8,pmVar7);
            this_00 = local_e8;
            goto LAB_001128e5;
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&val,"ambiguous short option: -",(allocator<char> *)&initial);
          std::operator+(&name,&val,last);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>(local_f0,&name);
        }
        std::__cxx11::string::~string((string *)&name);
        std::__cxx11::string::~string((string *)&val);
        this_00 = local_e8;
      }
LAB_001128e5:
      uVar13 = (ulong)(iVar12 + 1);
    }
    for (p_Var8 = (this_00->options)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var8 != p_Var1; p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8)) {
      cVar3 = (**(code **)(**(long **)(p_Var8 + 2) + 0x30))();
      if (cVar3 == '\0') {
        std::__cxx11::string::string((string *)&val,(string *)(p_Var8 + 1));
        std::operator+(&name,"need option: --",&val);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>(local_f0,&name);
        std::__cxx11::string::~string((string *)&name);
        std::__cxx11::string::~string((string *)&val);
      }
    }
    bVar2 = (local_e8->errors).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            (local_e8->errors).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
LAB_00112d9e:
    std::
    _Rb_tree<char,_std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&lookup._M_t);
  }
  return bVar2;
}

Assistant:

bool parse(int argc, const char* const argv[]) {
        errors.clear();
        others.clear();

        if (argc < 1) {
            errors.push_back("argument number must be longer than 0");
            return false;
        }
        if (prog_name == "") prog_name = argv[0];

        std::map<char, std::string> lookup;
        for (std::map<std::string, option_base*>::iterator p = options.begin(); p != options.end(); p++) {
            if (p->first.length() == 0) continue;
            char initial = p->second->short_name();
            if (initial) {
                if (lookup.count(initial) > 0) {
                    lookup[initial] = "";
                    errors.push_back(std::string("short option '") + initial + "' is ambiguous");
                    return false;
                } else
                    lookup[initial] = p->first;
            }
        }

        for (int i = 1; i < argc; i++) {
            if (strncmp(argv[i], "--", 2) == 0) {
                const char* p = strchr(argv[i] + 2, '=');
                if (p) {
                    std::string name(argv[i] + 2, p);
                    std::string val(p + 1);
                    set_option(name, val);
                } else {
                    std::string name(argv[i] + 2);
                    if (options.count(name) == 0) {
                        errors.push_back("undefined option: --" + name);
                        continue;
                    }
                    if (options[name]->has_value()) {
                        if (i + 1 >= argc) {
                            errors.push_back("option needs value: --" + name);
                            continue;
                        } else {
                            i++;
                            set_option(name, argv[i]);
                        }
                    } else {
                        set_option(name);
                    }
                }
            } else if (strncmp(argv[i], "-", 1) == 0) {
                if (!argv[i][1]) continue;
                char last = argv[i][1];
                for (int j = 2; argv[i][j]; j++) {
                    last = argv[i][j];
                    if (lookup.count(argv[i][j - 1]) == 0) {
                        errors.push_back(std::string("undefined short option: -") + argv[i][j - 1]);
                        continue;
                    }
                    if (lookup[argv[i][j - 1]] == "") {
                        errors.push_back(std::string("ambiguous short option: -") + argv[i][j - 1]);
                        continue;
                    }
                    set_option(lookup[argv[i][j - 1]]);
                }

                if (lookup.count(last) == 0) {
                    errors.push_back(std::string("undefined short option: -") + last);
                    continue;
                }
                if (lookup[last] == "") {
                    errors.push_back(std::string("ambiguous short option: -") + last);
                    continue;
                }

                if (i + 1 < argc && options[lookup[last]]->has_value()) {
                    set_option(lookup[last], argv[i + 1]);
                    i++;
                } else {
                    set_option(lookup[last]);
                }
            } else {
                others.push_back(argv[i]);
            }
        }

        for (std::map<std::string, option_base*>::iterator p = options.begin(); p != options.end(); p++)
            if (!p->second->valid()) errors.push_back("need option: --" + std::string(p->first));

        return errors.size() == 0;
    }